

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O0

int hash32_bat_601_prot(PowerPCCPU_conflict3 *cpu,target_ulong batu,target_ulong batl)

{
  int iVar1;
  ulong uVar2;
  uint local_2c;
  int pp;
  int key;
  CPUPPCState_conflict2 *env;
  target_ulong batl_local;
  target_ulong batu_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  if (((cpu->env).msr >> 0xe & 1) == 0) {
    uVar2 = batu & 8;
  }
  else {
    uVar2 = batu & 4;
  }
  local_2c = (uint)(uVar2 != 0);
  iVar1 = ppc_hash32_pp_prot(local_2c,(uint)batu & 3,0);
  return iVar1;
}

Assistant:

static int hash32_bat_601_prot(PowerPCCPU *cpu,
                               target_ulong batu, target_ulong batl)
{
    CPUPPCState *env = &cpu->env;
    int key, pp;

    pp = batu & BATU32_601_PP;
    if (msr_pr == 0) {
        key = !!(batu & BATU32_601_KS);
    } else {
        key = !!(batu & BATU32_601_KP);
    }
    return ppc_hash32_pp_prot(key, pp, 0);
}